

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFGeneric<(moira::Instr)238,(moira::Mode)8,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  Ea<(moira::Mode)8,_4> result;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  uVar3 = uVar3 & 0xffff;
  if ((uVar3 >> 0xe & 1) == 0) {
    cVar2 = 'f';
    lVar6 = 0;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar2;
      cVar2 = "frem"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar4 = (str->tab).raw;
      pcVar7 = str->ptr;
      do {
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
        pcVar7 = str->ptr;
      } while (pcVar7 < str->base + iVar4);
    }
    StrWriter::operator<<(str,(Fp)(uVar3 >> 10 & 7));
  }
  else {
    cVar2 = 'f';
    lVar6 = 0;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar2;
      cVar2 = "frem"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    StrWriter::operator<<(str,(Ffmt)(uVar3 >> 10 & 7));
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar4 = (str->tab).raw;
      pcVar7 = str->ptr;
      do {
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
        pcVar7 = str->ptr;
      } while (pcVar7 < str->base + iVar4);
    }
    local_44 = *addr;
    *addr = local_44 + 2;
    local_40 = op & 7;
    iVar4 = (*this->_vptr_Moira[6])(this);
    *addr = *addr + 2;
    uVar5 = (*this->_vptr_Moira[6])(this);
    local_3c = uVar5 & 0xffff | iVar4 << 0x10;
    StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_44);
  }
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  StrWriter::operator<<(str,(Fp)(uVar3 >> 7 & 7));
  return;
}

Assistant:

void
Moira::dasmFGeneric(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);

    if (ext & 0x4000) {

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 6: // Byte Integer
                    val = dasmIncRead<Word>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Word>(reg, addr);
            }
        } else {
            str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }

    str << Sep{} << Fp{dst};
}